

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_rand.cpp
# Opt level: O0

void __thiscall crnlib::well512::seed(well512 *this,uint32 seed1,uint32 seed2,uint32 seed3)

{
  uint in_ECX;
  uint in_EDX;
  uint32 in_ESI;
  long in_RDI;
  uint i;
  uint32 jcong;
  uint32 jsr;
  undefined4 local_20;
  undefined4 local_1c;
  undefined4 local_18;
  undefined4 local_c;
  
  local_1c = in_ECX;
  local_18 = in_EDX;
  local_c = in_ESI;
  for (local_20 = 0; local_20 < 0x10; local_20 = local_20 + 1) {
    local_18 = local_18 << 0x11 ^ local_18;
    local_18 = local_18 >> 0xd ^ local_18;
    local_18 = local_18 << 5 ^ local_18;
    local_c = bitmix32c(local_c);
    local_1c = local_1c * 0x10dcd + 0x12d687;
    *(uint32 *)(in_RDI + (ulong)local_20 * 4) = local_c ^ local_18 ^ local_1c;
  }
  *(undefined4 *)(in_RDI + 0x40) = 0;
  return;
}

Assistant:

void well512::seed(uint32 seed1, uint32 seed2, uint32 seed3) {
  uint32 jsr = seed2;
  uint32 jcong = seed3;

  for (uint i = 0; i < cStateSize; i++) {
    SHR3;
    seed1 = bitmix32c(seed1);
    CONG;

    m_state[i] = seed1 ^ jsr ^ jcong;
  }
  m_index = 0;
}